

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_data.hpp
# Opt level: O1

void duckdb::ArrowScalarBaseData<signed_char,_signed_char,_duckdb::ArrowScalarConverter>::Append
               (ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  reference this;
  data_ptr_t pdVar1;
  long lVar2;
  idx_t iVar3;
  UnifiedVectorFormat format;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,input_size,&local_78);
  AppendValidity(append_data,&local_78,from,to);
  this = vector<duckdb::ArrowBuffer,_true>::operator[](&append_data->arrow_buffers,1);
  lVar2 = to - from;
  iVar3 = this->count + lVar2;
  ArrowBuffer::reserve(this,iVar3);
  this->count = iVar3;
  if (from < to) {
    pdVar1 = this->dataptr;
    do {
      iVar3 = from;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar3 = (idx_t)(local_78.sel)->sel_vector[from];
      }
      pdVar1[append_data->row_count] = local_78.data[iVar3];
      from = from + 1;
      pdVar1 = pdVar1 + 1;
    } while (to != from);
  }
  append_data->row_count = append_data->row_count + lVar2;
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void Append(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to, idx_t input_size) {
		D_ASSERT(to >= from);
		idx_t size = to - from;
		D_ASSERT(size <= input_size);
		UnifiedVectorFormat format;
		input.ToUnifiedFormat(input_size, format);

		// append the validity mask
		AppendValidity(append_data, format, from, to);

		// append the main data
		auto &main_buffer = append_data.GetMainBuffer();
		main_buffer.resize(main_buffer.size() + sizeof(TGT) * size);
		auto data = UnifiedVectorFormat::GetData<SRC>(format);
		auto result_data = main_buffer.GetData<TGT>();

		for (idx_t i = from; i < to; i++) {
			auto source_idx = format.sel->get_index(i);
			auto result_idx = append_data.row_count + i - from;

			if (OP::SkipNulls() && !format.validity.RowIsValid(source_idx)) {
				OP::template SetNull<TGT>(result_data[result_idx]);
				continue;
			}
			result_data[result_idx] = OP::template Operation<TGT, SRC>(data[source_idx]);
		}
		append_data.row_count += size;
	}